

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::WriteCheckpoint(cmCTestMultiProcessHandler *this,int index)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  string fname;
  ofstream fout;
  long *local_230;
  long local_220;
  long lStack_218;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [14];
  ios_base local_118 [264];
  
  cmCTest::GetBinaryDir_abi_cxx11_((string *)local_210,this->CTest);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_210);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_220 = *plVar3;
    lStack_218 = plVar1[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar3;
    local_230 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._0_8_ != local_200) {
    operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_210);
  std::ofstream::open(local_210,(_Ios_Openmode)local_230);
  poVar2 = (ostream *)std::ostream::operator<<(local_210,index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::ofstream::close();
  local_210._0_8_ = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18)) = __M_insert<void_const*>;
  std::filebuf::~filebuf((filebuf *)(local_210 + 8));
  std::ios_base::~ios_base(local_118);
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::WriteCheckpoint(int index)
{
  std::string fname = this->CTest->GetBinaryDir()
    + "/Testing/Temporary/CTestCheckpoint.txt";
  cmsys::ofstream fout;
  fout.open(fname.c_str(), std::ios::app);
  fout << index << "\n";
  fout.close();
}